

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_option.hpp
# Opt level: O1

void __thiscall
duckdb::CSVOption<duckdb::StrpTimeFormat>::Set
          (CSVOption<duckdb::StrpTimeFormat> *this,StrpTimeFormat *value_p,bool by_user)

{
  if (this->set_by_user == false) {
    ::std::__cxx11::string::_M_assign((string *)&(this->value).super_StrTimeFormat.format_specifier)
    ;
    ::std::vector<duckdb::StrTimeSpecifier,_std::allocator<duckdb::StrTimeSpecifier>_>::operator=
              (&(this->value).super_StrTimeFormat.specifiers.
                super_vector<duckdb::StrTimeSpecifier,_std::allocator<duckdb::StrTimeSpecifier>_>,
               &(value_p->super_StrTimeFormat).specifiers.
                super_vector<duckdb::StrTimeSpecifier,_std::allocator<duckdb::StrTimeSpecifier>_>);
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&(this->value).super_StrTimeFormat.literals,
                &(value_p->super_StrTimeFormat).literals.
                 super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               );
    (this->value).super_StrTimeFormat.constant_size = (value_p->super_StrTimeFormat).constant_size;
    ::std::vector<int,_std::allocator<int>_>::operator=
              (&(this->value).super_StrTimeFormat.numeric_width.
                super_vector<int,_std::allocator<int>_>,
               &(value_p->super_StrTimeFormat).numeric_width.super_vector<int,_std::allocator<int>_>
              );
    this->set_by_user = by_user;
  }
  return;
}

Assistant:

void Set(T value_p, bool by_user = true) {
		D_ASSERT(!(by_user && set_by_user));
		if (!set_by_user) {
			// If it's not set by user we can change the value
			value = value_p;
			set_by_user = by_user;
		}
	}